

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageExtractor.cpp
# Opt level: O2

int Assimp_Extract(char **params,uint num)

{
  char cVar1;
  aiTexture *tx;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  long lVar5;
  aiScene *paVar6;
  FILE *__s;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  size_type sVar10;
  bool bVar11;
  uint local_14c;
  uint local_148;
  allocator<char> local_141;
  undefined8 local_140;
  uint local_134;
  string out_cpy;
  string out;
  string extension;
  string in;
  string out_ext;
  char tmp [10];
  ImportData import;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (num == 0) {
    puts("assimp extract: Invalid number of arguments. See \'assimp extract --help\'");
    return 1;
  }
  pcVar9 = *params;
  cVar1 = *pcVar9;
  if (((((cVar1 == '-') && (pcVar9[1] == 'h')) && (pcVar9[2] == '\0')) ||
      (iVar3 = strcmp(pcVar9,"--help"), iVar3 == 0)) ||
     (((cVar1 == '-' && (pcVar9[1] == '?')) && (pcVar9[2] == '\0')))) {
    printf("%s",AICMD_MSG_DUMP_HELP_E);
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,pcVar9,(allocator<char> *)&import);
  if (num == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&out,"-",(allocator<char> *)&import);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&out,params[1],(allocator<char> *)&import);
  }
  import.ppFlags = 0;
  import.showLog = false;
  import.logFile._M_dataplus._M_p = (pointer)&import.logFile.field_2;
  import.logFile._M_string_length = 0;
  import.logFile.field_2._M_local_buf[0] = '\0';
  import.verbose = false;
  import.log = false;
  ProcessStandardArguments(&import,params + 1,num - 1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extension,"bmp",(allocator<char> *)&out_cpy);
  uVar8 = (ulong)(*out._M_dataplus._M_p != '-');
  local_140 = 0;
  local_148 = 0xffffffff;
  local_134 = 0;
LAB_00306e65:
  uVar8 = uVar8 + 1;
  if (uVar8 < num) {
    pcVar9 = params[uVar8];
    if (pcVar9 != (char *)0x0) {
      cVar1 = *pcVar9;
      if ((cVar1 == '-') && (pcVar9[1] == 'f')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&out_cpy,pcVar9 + 2,(allocator<char> *)&out_ext);
      }
      else {
        iVar3 = strncmp(pcVar9,"--format=",9);
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar9,"--nosuffix");
          if ((iVar3 != 0) && (((cVar1 != '-' || (pcVar9[1] != 's')) || (pcVar9[2] != '\0')))) {
            iVar3 = strncmp(pcVar9,"--texture=",10);
            if (iVar3 == 0) {
              pcVar9 = pcVar9 + 10;
            }
            else {
              if ((cVar1 != '-') || (pcVar9[1] != 't')) {
                iVar3 = strcmp(pcVar9,"-ba");
                if ((iVar3 == 0) || (iVar3 = strcmp(pcVar9,"--bmp-with-alpha"), iVar3 == 0)) {
                  local_134 = 1;
                }
                goto LAB_00306e65;
              }
              pcVar9 = pcVar9 + 2;
            }
            local_148 = Assimp::strtoul10(pcVar9,(char **)0x0);
            goto LAB_00306e65;
          }
          local_140 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
          goto LAB_00306e65;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&out_cpy,pcVar9 + 9,(allocator<char> *)&out_ext);
      }
      std::__cxx11::string::operator=((string *)&extension,(string *)&out_cpy);
      std::__cxx11::string::~string((string *)&out_cpy);
    }
    goto LAB_00306e65;
  }
  for (sVar10 = 0; extension._M_string_length != sVar10; sVar10 = sVar10 + 1) {
    iVar3 = tolower((int)extension._M_dataplus._M_p[sVar10]);
    extension._M_dataplus._M_p[sVar10] = (char)iVar3;
  }
  if (*out._M_dataplus._M_p == '-') {
    std::__cxx11::string::rfind((char)&in,0x2e);
    std::__cxx11::string::substr((ulong)&out_cpy,(ulong)&in);
    std::__cxx11::string::operator=((string *)&out,(string *)&out_cpy);
    std::__cxx11::string::~string((string *)&out_cpy);
  }
  lVar5 = std::__cxx11::string::rfind((char)&out,0x2e);
  if (lVar5 != -1) {
    std::__cxx11::string::substr((ulong)&out_cpy,(ulong)&out);
    std::__cxx11::string::operator=((string *)&extension,(string *)&out_cpy);
    std::__cxx11::string::~string((string *)&out_cpy);
    std::__cxx11::string::substr((ulong)&out_cpy,(ulong)&out);
    std::__cxx11::string::operator=((string *)&out,(string *)&out_cpy);
    std::__cxx11::string::~string((string *)&out_cpy);
  }
  paVar6 = ImportModel(&import,&in);
  if (paVar6 == (aiScene *)0x0) {
    printf("assimp extract: Unable to load input file %s\n",in._M_dataplus._M_p);
    local_14c = 5;
  }
  else {
    bVar11 = local_148 == 0xffffffff;
    if (bVar11) {
      printf("assimp extract: Exporting %i textures\n",(ulong)paVar6->mNumTextures);
    }
    else if (paVar6->mNumTextures <= local_148) {
      printf("assimp extract: Texture %i requested, but there are just %i textures\n",
             (ulong)local_148);
      local_14c = 6;
      goto LAB_00307313;
    }
    local_140 = CONCAT71((int7)((ulong)local_140 >> 8),(byte)local_140 & local_148 != 0xffffffff);
    for (uVar8 = 0; uVar8 < paVar6->mNumTextures; uVar8 = uVar8 + 1) {
      if (local_148 == 0xffffffff || local_148 == uVar8) {
        tx = paVar6->mTextures[uVar8];
        std::__cxx11::string::string((string *)&out_cpy,(string *)&out);
        std::__cxx11::string::string((string *)&out_ext,(string *)&extension);
        if ((char)local_140 == '\0') {
          std::__cxx11::string::append((char *)&out_cpy);
          Assimp::ASSIMP_itoa10<10ul>(&tmp,(int32_t)uVar8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,tmp,&local_141);
          std::__cxx11::string::append((string *)&out_cpy);
          std::__cxx11::string::~string((string *)&local_50);
        }
        if (tx->mHeight == 0) {
          printf("assimp extract: Texture %i is compressed (%s). Writing native file format.\n",
                 uVar8 & 0xffffffff,tx->achFormatHint);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,tx->achFormatHint,(allocator<char> *)tmp);
          std::__cxx11::string::operator=((string *)&out_ext,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::operator+(&local_50,".",&out_ext);
        std::__cxx11::string::append((string *)&out_cpy);
        std::__cxx11::string::~string((string *)&local_50);
        __s = fopen(out_cpy._M_dataplus._M_p,"wb");
        if (__s == (FILE *)0x0) {
          printf("assimp extract: Unable to open output file %s\n",out_cpy._M_dataplus._M_p);
          local_14c = 7;
          bVar2 = false;
        }
        else {
          if (tx->mHeight == 0) {
            sVar7 = fwrite(tx->pcData,(ulong)tx->mWidth,1,__s);
            uVar4 = (uint)(sVar7 != 1);
          }
          else {
            uVar4 = DoExport(tx,(FILE *)__s,&extension,local_134);
          }
          fclose(__s);
          printf("assimp extract: Wrote texture %i to %s\n",uVar8 & 0xffffffff,
                 out_cpy._M_dataplus._M_p);
          bVar2 = bVar11;
          if (local_148 != 0xffffffff) {
            local_14c = uVar4;
          }
        }
        std::__cxx11::string::~string((string *)&out_ext);
        std::__cxx11::string::~string((string *)&out_cpy);
        if (!bVar2) goto LAB_00307313;
      }
    }
    local_14c = 0;
  }
LAB_00307313:
  std::__cxx11::string::~string((string *)&extension);
  std::__cxx11::string::~string((string *)&import.logFile);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&in);
  return local_14c;
}

Assistant:

int Assimp_Extract (const char* const* params, unsigned int num)
{
    const char* const invalid = "assimp extract: Invalid number of arguments. See \'assimp extract --help\'\n";
    // assimp extract in out [options]
    if (num < 1) {
        printf(invalid);
        return 1;
    }

    // --help
    if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
        printf("%s",AICMD_MSG_DUMP_HELP_E);
        return 0;
    }



    std::string in  = std::string(params[0]);
    std::string out = (num > 1 ? std::string(params[1]) : "-");

    // get import flags
    ImportData import;
    ProcessStandardArguments(import,params+1,num-1);

    bool nosuffix = false;
    unsigned int texIdx  = 0xffffffff, flags = 0;

    // process other flags
    std::string extension = "bmp";
    for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)		{
        if (!params[i]) {
            continue;
        }

        if (!strncmp( params[i], "-f",2)) {
            extension = std::string(params[i]+2);
        }
        else if ( !strncmp( params[i], "--format=",9)) {
            extension = std::string(params[i]+9);
        }
        else if ( !strcmp( params[i], "--nosuffix") || !strcmp(params[i],"-s")) {
            nosuffix = true;
        }
        else if ( !strncmp( params[i], "--texture=",10)) {
            texIdx = Assimp::strtoul10(params[i]+10);
        }
        else if ( !strncmp( params[i], "-t",2)) {
            texIdx = Assimp::strtoul10(params[i]+2);
        }
        else if ( !strcmp( params[i], "-ba") ||  !strcmp( params[i], "--bmp-with-alpha")) {
            flags |= AI_EXTRACT_WRITE_BMP_ALPHA;
        }
#if 0
        else {
            printf("Unknown parameter: %s\n",params[i]);
            return 10;
        }
#endif
    }

    std::transform(extension.begin(),extension.end(),extension.begin(),::tolower);
    
    if (out[0] == '-') {
        // take file name from input file
        std::string::size_type s = in.find_last_of('.');
        if (s == std::string::npos)
            s = in.length();

        out = in.substr(0,s);
    }

    // take file extension from file name, if given
    std::string::size_type s = out.find_last_of('.');
    if (s != std::string::npos) {
        extension = out.substr(s+1,in.length()-(s+1));
        out = out.substr(0,s);
    }

    // import the main model
    const aiScene* scene = ImportModel(import,in);
    if (!scene) {
        printf("assimp extract: Unable to load input file %s\n",in.c_str());
        return 5;
    }

    // get the texture(s) to be exported
    if (texIdx != 0xffffffff) {

        // check whether the requested texture is existing
        if (texIdx >= scene->mNumTextures) {
            ::printf("assimp extract: Texture %i requested, but there are just %i textures\n",
                texIdx, scene->mNumTextures);
            return 6;
        }
    }
    else {
        ::printf("assimp extract: Exporting %i textures\n",scene->mNumTextures);
    }

    // now write all output textures
    for (unsigned int i = 0; i < scene->mNumTextures;++i)	{
        if (texIdx != 0xffffffff && texIdx != i) {
            continue;
        }

        const aiTexture* tex = scene->mTextures[i];
        std::string out_cpy = out, out_ext = extension;

        // append suffix if necessary - always if all textures are exported
        if (!nosuffix || (texIdx == 0xffffffff)) {
            out_cpy.append  ("_img");
            char tmp[10];
            Assimp::ASSIMP_itoa10(tmp,i);

            out_cpy.append(std::string(tmp));
        }

        // if the texture is a compressed one, we'll export
        // it to its native file format
        if (!tex->mHeight) {
            printf("assimp extract: Texture %i is compressed (%s). Writing native file format.\n",
                i,tex->achFormatHint);

            // modify file extension
            out_ext = std::string(tex->achFormatHint);
        }
        out_cpy.append("."+out_ext);

        // open output file
        FILE* p = ::fopen(out_cpy.c_str(),"wb");
        if (!p)  {
            printf("assimp extract: Unable to open output file %s\n",out_cpy.c_str());
            return 7;
        }
        int m;

        if (!tex->mHeight) {
            m = (1 != fwrite(tex->pcData,tex->mWidth,1,p));
        }
        else m = DoExport(tex,p,extension,flags);
        ::fclose(p);

        printf("assimp extract: Wrote texture %i to %s\n",i, out_cpy.c_str());
        if (texIdx != 0xffffffff)
            return m;
    }
    return 0;
}